

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

void failure_start(char *filename,wchar_t line,char *fmt,...)

{
  bool bVar1;
  char *in_RCX;
  uint in_ESI;
  char *in_RDI;
  va_list ap;
  __va_list_tag *in_stack_ffffffffffffff28;
  
  failures = failures + L'\x01';
  failed_filename = in_RDI;
  failed_lines[(int)in_ESI].count = failed_lines[(int)in_ESI].count + 1;
  if (verbosity == L'\x01') {
    bVar1 = failed_lines[(int)in_ESI].count < 2;
  }
  else {
    bVar1 = L'\x01' < verbosity;
  }
  log_console = (wchar_t)bVar1;
  logprintf("%s:%d: ",in_RDI,(ulong)in_ESI);
  vlogprintf(in_RCX,in_stack_ffffffffffffff28);
  logprintf("\n");
  if ((msg != (char *)0x0) && (*msg != '\0')) {
    logprintf("   Description: %s\n",msg);
    msg = (char *)0x0;
  }
  if (verbosity == L'\x01') {
    log_console = L'\0';
  }
  return;
}

Assistant:

static void
failure_start(const char *filename, int line, const char *fmt, ...)
{
	va_list ap;

	/* Record another failure for this line. */
	++failures;
	failed_filename = filename;
	failed_lines[line].count++;

	/* Determine whether to log header to console. */
	switch (verbosity) {
	case VERBOSITY_LIGHT_REPORT:
		log_console = (failed_lines[line].count < 2);
		break;
	default:
		log_console = (verbosity >= VERBOSITY_FULL);
	}

	/* Log file:line header for this failure */
	va_start(ap, fmt);
#if _MSC_VER
	logprintf("%s(%d): ", filename, line);
#else
	logprintf("%s:%d: ", filename, line);
#endif
	vlogprintf(fmt, ap);
	va_end(ap);
	logprintf("\n");

	if (msg != NULL && msg[0] != '\0') {
		logprintf("   Description: %s\n", msg);
		msg = NULL;
	}

	/* Determine whether to log details to console. */
	if (verbosity == VERBOSITY_LIGHT_REPORT)
		log_console = 0;
}